

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O0

bool __thiscall mxx::comm::is_builtin(comm *this,MPI_Comm *c)

{
  bool local_19;
  MPI_Comm *c_local;
  comm *this_local;
  
  local_19 = true;
  if ((*c != (MPI_Comm)&ompi_mpi_comm_world) &&
     (local_19 = true, *c != (MPI_Comm)&ompi_mpi_comm_self)) {
    local_19 = *c == (MPI_Comm)&ompi_mpi_comm_null;
  }
  return local_19;
}

Assistant:

bool is_builtin(const MPI_Comm& c) const {
        return c == MPI_COMM_WORLD
            || c == MPI_COMM_SELF
            || c == MPI_COMM_NULL;
    }